

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int gettime(int casep)

{
  undefined1 local_20 [8];
  timeval timev;
  int casep_local;
  
  timev.tv_usec._0_4_ = casep;
  switch(casep) {
  case 0:
    gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
    timev.tv_usec._4_4_ = (local_20._0_4_ + -0x7e36b500) * 1000 + (int)(timev.tv_sec / 1000);
    break;
  case 1:
    timev.tv_usec._4_4_ = MiscStats->starttime;
    break;
  case 2:
    update_miscstats();
    timev.tv_usec._4_4_ = MiscStats->totaltime;
    break;
  case 3:
    timev.tv_usec._4_4_ = MiscStats->gctime;
    break;
  case 4:
    gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
    timev.tv_usec._4_4_ = local_20._0_4_ + -0x7e36b500;
    break;
  case 5:
    gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
    timev.tv_usec._4_4_ = local_20._0_4_ + 0x1c94b00;
    break;
  case 6:
    timev.tv_usec._4_4_ = 0x62;
    break;
  case 7:
    timev.tv_usec._4_4_ = 0x131;
    break;
  case 8:
    tzset();
    timev.tv_usec._4_4_ = (int)(_timezone / 0xe10);
    break;
  default:
    timev.tv_usec._4_4_ = 0;
  }
  return timev.tv_usec._4_4_;
}

Assistant:

static int gettime(int casep)
{
#ifdef DOS
  struct dostime_t dtm; /* for hundredths of secs */
#else
  struct timeval timev;
#endif /* DOS */
  switch (casep) {
    case 0: /* elapsed time in alto milliseconds */
#ifdef DOS
      _dos_gettime(&dtm);
      return ((time(0) + UNIX_ALTO_TIME_DIFF) * 1000) + (10 * dtm.hsecond);
#else  /* DOS */
      gettimeofday(&timev, NULL);
      return ((timev.tv_sec + UNIX_ALTO_TIME_DIFF) * 1000 + timev.tv_usec / 1000);
#endif /* DOS */

    case 1: /* starting elapsed time in milliseconds */ return (MiscStats->starttime);

    case 2: /* run time, this process, in milliseconds */
      update_miscstats();
      return (MiscStats->totaltime);

    case 3: /* total GC time in milliseconds */ return (MiscStats->gctime);

    case 4: /* current time of day in Alto format */
#ifdef DOS
      return (time(0) + UNIX_ALTO_TIME_DIFF);
#else
      gettimeofday(&timev, NULL);
      return (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#endif

    case 5: /* current time of day in Interlisp format */
#ifdef DOS
      return (time(0) + LISP_UNIX_TIME_DIFF);
#else
      gettimeofday(&timev, NULL);
      return (timev.tv_sec + LISP_UNIX_TIME_DIFF);
#endif

    case 6:
      return (98); /* this is wrong, only works in PST */

    case 7:
      return (305); /* this is wrong, only works in PST */

    case 8:
      /* other methods of determining timezone offset are unreliable and/or deprecated */
      /* timezone is declared in <time.h>; the time mechanisms must be initialized     */
      /* Unfortunately, FreeBSD does not support the timezone external variable, nor   */
      /* does gettimeofday() seem to produce the correct timezone values.	       */
      tzset();
#if defined(MAIKO_OS_FREEBSD)
      time_t tv = time(NULL);
      struct tm *tm = localtime(&tv);
      return (tm->tm_gmtoff / -3600);
#else
      return (timezone / 3600); /* timezone, extern, is #secs diff GMT to local. */
#endif
    default: return (0);
  }
}